

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
DensityCalculator<double,double>::initialize_bdens<InputData<double,unsigned_long>>
          (DensityCalculator<double,double> *this,InputData<double,_unsigned_long> *input_data,
          ModelParams *model_params,vector<unsigned_long,_std::allocator<unsigned_long>_> *ix_arr,
          ColumnSampler<double> *col_sampler)

{
  DensityCalculator<double,double> DVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  size_t *psVar6;
  bool bVar7;
  size_t sVar8;
  double *in_R9;
  double dVar9;
  bool unsplittable;
  size_t col;
  DensityCalculator<double,double> *local_68;
  size_t npresent;
  vector<signed_char,_std::allocator<signed_char>_> categ_present;
  
  DVar1 = (DensityCalculator<double,double>)model_params->fast_bratio;
  this[0x90] = DVar1;
  if (DVar1 == (DensityCalculator<double,double>)0x1) {
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)this,model_params->max_depth + 3);
    categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)this,(double *)&categ_present);
  }
  if (input_data->ncat_ == (int *)0x0 && input_data->range_low == (double *)0x0) {
    if (input_data->ncols_numeric != 0) {
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)(this + 0x78),
                 model_params->max_depth + 3);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)(this + 0x48),input_data->ncols_numeric)
      ;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)(this + 0x60),input_data->ncols_numeric)
      ;
      if (this[0x90] == (DensityCalculator<double,double>)0x0) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)(this + 0x98),
                   input_data->ncols_numeric);
      }
    }
    if (input_data->ncols_categ == 0) {
      unsplittable = false;
      npresent = 0;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)(this + 200),model_params->max_depth + 2);
      npresent = 0;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      unsplittable = false;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (input_data->ncols_categ != 0) {
        std::vector<signed_char,_std::allocator<signed_char>_>::resize
                  (&categ_present,(long)input_data->max_categ);
      }
    }
    ColumnSampler<double>::prepare_full_pass(col_sampler);
    local_68 = this + 0xb0;
    while( true ) {
      bVar7 = ColumnSampler<double>::sample_col(col_sampler,&col);
      if (!bVar7) break;
      if (col < input_data->ncols_numeric) {
        psVar6 = (ix_arr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        if (input_data->Xc_indptr == (unsigned_long *)0x0) {
          in_R9 = (double *)(*(long *)(this + 0x48) + col * 8);
          get_range<double>(psVar6,input_data->numeric_data + input_data->nrows * col,0,
                            ((long)(ix_arr->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 3)
                            - 1,model_params->missing_action,in_R9,
                            (double *)(col * 8 + *(long *)(this + 0x60)),&unsplittable);
        }
        else {
          in_R9 = (double *)input_data->Xc_ind;
          get_range<double,unsigned_long>
                    (psVar6,0,((long)(ix_arr->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 3
                              ) - 1,col,input_data->Xc,(unsigned_long *)in_R9,input_data->Xc_indptr,
                     model_params->missing_action,(double *)(*(long *)(this + 0x48) + col * 8),
                     (double *)(col * 8 + *(long *)(this + 0x60)),&unsplittable);
        }
        if (unsplittable == true) {
          *(undefined8 *)(*(long *)(this + 0x48) + col * 8) = 0;
          *(undefined8 *)(*(long *)(this + 0x60) + col * 8) = 0;
          if (this[0x90] == (DensityCalculator<double,double>)0x0) {
            *(undefined8 *)(*(long *)(this + 0x98) + col * 8) = 0;
          }
          ColumnSampler<double>::drop_col(col_sampler,col);
        }
        if (this[0x90] == (DensityCalculator<double,double>)0x0) {
          dVar9 = *(double *)(*(long *)(this + 0x60) + col * 8) -
                  *(double *)(*(long *)(this + 0x48) + col * 8);
          if (dVar9 <= 0.0) {
            dVar9 = 0.0;
          }
          *(double *)(*(long *)(this + 0x98) + col * 8) = dVar9;
        }
      }
      else {
        psVar6 = (ix_arr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        get_categs(psVar6,input_data->categ_data +
                          (col - input_data->ncols_numeric) * input_data->nrows,0,
                   ((long)(ix_arr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 3) - 1,
                   input_data->ncat[col],(MissingAction)in_R9,
                   categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,&npresent,&unsplittable);
        if (unsplittable == true) {
          *(undefined4 *)(*(long *)local_68 + (col - input_data->ncols_numeric) * 4) = 1;
          ColumnSampler<double>::drop_col(col_sampler,col);
        }
        else {
          *(undefined4 *)(*(long *)local_68 + (col - input_data->ncols_numeric) * 4) =
               (undefined4)npresent;
        }
      }
    }
    if (this[0x90] == (DensityCalculator<double,double>)0x0) {
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)(this + 0xe0),
                 (vector<int,_std::allocator<int>_> *)local_68);
    }
    std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
              (&categ_present.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  }
  else {
    if (input_data->ncols_numeric != 0) {
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)(this + 0x78),
                 model_params->max_depth + 3);
      std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
                ((vector<double,std::allocator<double>> *)(this + 0x48),input_data->range_low,
                 input_data->range_low + input_data->ncols_numeric);
      std::vector<double,std::allocator<double>>::_M_assign_aux<double*>
                ((vector<double,std::allocator<double>> *)(this + 0x60),input_data->range_high,
                 input_data->range_high + input_data->ncols_numeric);
    }
    if (input_data->ncols_categ != 0) {
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)(this + 200),model_params->max_depth + 2);
      std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
                ((vector<int,std::allocator<int>> *)(this + 0xb0),input_data->ncat_,
                 input_data->ncat_ + input_data->ncols_categ);
    }
    if (this[0x90] == (DensityCalculator<double,double>)0x0) {
      if (input_data->ncols_numeric != 0) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)(this + 0x98),
                   input_data->ncols_numeric);
        sVar2 = input_data->ncols_numeric;
        lVar3 = *(long *)(this + 0x48);
        lVar4 = *(long *)(this + 0x60);
        lVar5 = *(long *)(this + 0x98);
        for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
          *(double *)(lVar5 + sVar8 * 8) =
               *(double *)(lVar4 + sVar8 * 8) - *(double *)(lVar3 + sVar8 * 8);
        }
      }
      if (input_data->ncols_categ != 0) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)(this + 0xe0),
                   (vector<int,_std::allocator<int>_> *)(this + 0xb0));
      }
    }
  }
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::initialize_bdens(const InputData &input_data,
                                         const ModelParams &model_params,
                                         std::vector<size_t> &ix_arr,
                                         ColumnSampler<ldouble_safe> &col_sampler)
{
    this->fast_bratio = model_params.fast_bratio;
    if (this->fast_bratio)
    {
        this->multipliers.reserve(model_params.max_depth + 3);
        this->multipliers.push_back(0);
    }

    if (input_data.range_low != NULL || input_data.ncat_ != NULL)
    {
        if (input_data.ncols_numeric)
        {
            this->queue_box.reserve(model_params.max_depth+3);
            this->box_low.assign(input_data.range_low, input_data.range_low + input_data.ncols_numeric);
            this->box_high.assign(input_data.range_high, input_data.range_high + input_data.ncols_numeric);
        }

        if (input_data.ncols_categ)
        {
            this->queue_ncat.reserve(model_params.max_depth+2);
            this->ncat.assign(input_data.ncat_, input_data.ncat_ + input_data.ncols_categ);
        }

        if (!this->fast_bratio)
        {
            if (input_data.ncols_numeric)
            {
                this->ranges.resize(input_data.ncols_numeric);
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                    this->ranges[col] = this->box_high[col] - this->box_low[col];
            }

            if (input_data.ncols_categ)
            {
                this->ncat_orig = this->ncat;
            }
        }

        return;
    }

    if (input_data.ncols_numeric)
    {
        this->queue_box.reserve(model_params.max_depth+3);
        this->box_low.resize(input_data.ncols_numeric);
        this->box_high.resize(input_data.ncols_numeric);
        if (!this->fast_bratio)
            this->ranges.resize(input_data.ncols_numeric);
    }
    if (input_data.ncols_categ)
    {
        this->queue_ncat.reserve(model_params.max_depth+2);
    }
    bool unsplittable = false;
    
    size_t npresent = 0;
    std::vector<signed char> categ_present;
    if (input_data.ncols_categ)
    {
        categ_present.resize(input_data.max_categ);
    }


    col_sampler.prepare_full_pass();
    size_t col;
    while (col_sampler.sample_col(col))
    {
        if (col < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr != NULL)
            {
                get_range((size_t*)ix_arr.data(), (size_t)0, ix_arr.size()-(size_t)1, col,
                          input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }

            else
            {
                get_range((size_t*)ix_arr.data(), input_data.numeric_data + input_data.nrows * col, (size_t)0, ix_arr.size()-(size_t)1,
                          model_params.missing_action, this->box_low[col], this->box_high[col], unsplittable);
            }


            if (unsplittable)
            {
                this->box_low[col] = 0;
                this->box_high[col] = 0;
                if (!this->fast_bratio)
                    this->ranges[col] = 0;
                col_sampler.drop_col(col);
            }

            if (!this->fast_bratio)
            {
                this->ranges[col] = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
                this->ranges[col] = std::fmax(this->ranges[col], (ldouble_safe)0);
            }
        }

        else
        {
            get_categs((size_t*)ix_arr.data(),
                       input_data.categ_data + input_data.nrows * (col - input_data.ncols_numeric),
                       (size_t)0, ix_arr.size()-(size_t)1, input_data.ncat[col],
                       model_params.missing_action, categ_present.data(), npresent, unsplittable);

            if (unsplittable)
            {
                this->ncat[col - input_data.ncols_numeric] = 1;
                col_sampler.drop_col(col);
            }

            else
            {
                this->ncat[col - input_data.ncols_numeric] = npresent;
            }
        }
    }

    if (!this->fast_bratio)
        this->ncat_orig = this->ncat;
}